

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# renderer.cpp
# Opt level: O2

Color __thiscall
Renderer::renderPixel
          (Renderer *this,function<vec3f_(Ray,_Sampler_&)> *func,vec2f *pixelpos,vec2f *pixelsize)

{
  undefined1 auVar1 [16];
  MT19937Sampler *this_00;
  size_t sVar2;
  size_t sVar3;
  int sampleID;
  undefined8 extraout_XMM0_Qb;
  undefined1 auVar4 [16];
  float fVar5;
  vec3f vVar6;
  Color CVar7;
  float local_94;
  float local_88;
  float fStack_84;
  float fStack_80;
  float fStack_7c;
  Ray local_68;
  Ray ray;
  
  local_88 = 0.0;
  fStack_84 = 0.0;
  fStack_80 = 0.0;
  fStack_7c = 0.0;
  sampleID = 0;
  local_94 = 0.0;
  while( true ) {
    if (this->nspp <= sampleID) {
      fVar5 = (float)this->nspp;
      CVar7.z = local_94 / fVar5;
      auVar1._4_4_ = fStack_84;
      auVar1._0_4_ = local_88;
      auVar1._8_4_ = fStack_80;
      auVar1._12_4_ = fStack_7c;
      auVar4._4_4_ = fVar5;
      auVar4._0_4_ = fVar5;
      auVar4._8_4_ = fVar5;
      auVar4._12_4_ = fVar5;
      auVar4 = divps(auVar1,auVar4);
      CVar7._0_8_ = auVar4._0_8_;
      return CVar7;
    }
    this_00 = (MT19937Sampler *)operator_new(0x1390);
    sVar2 = std::hash<float>::operator()((hash<float> *)&local_68,pixelpos->x);
    sVar3 = std::hash<float>::operator()((hash<float> *)&ray,PI * pixelpos->y);
    MT19937Sampler::MT19937Sampler(this_00,(int)sVar2 * 4 ^ (uint)sVar3,sampleID);
    (*(this_00->super_Sampler)._vptr_Sampler[1])(this_00);
    (**this->camera->_vptr_Camera)(&ray,this->camera,this_00);
    local_68.dir.y = ray.dir.y;
    local_68.dir.z = ray.dir.z;
    local_68.origin.x = ray.origin.x;
    local_68.origin.y = ray.origin.y;
    local_68.origin.z = ray.origin.z;
    local_68.dir.x = ray.dir.x;
    if ((func->super__Function_base)._M_manager == (_Manager_type)0x0) break;
    vVar6 = (*func->_M_invoker)((_Any_data *)func,&local_68,(Sampler *)this_00);
    local_88 = local_88 + vVar6.x;
    fStack_84 = fStack_84 + vVar6.y;
    fStack_80 = fStack_80 + (float)extraout_XMM0_Qb;
    fStack_7c = fStack_7c + (float)((ulong)extraout_XMM0_Qb >> 0x20);
    local_94 = local_94 + vVar6.z;
    operator_delete(this_00,8);
    sampleID = sampleID + 1;
  }
  std::__throw_bad_function_call();
}

Assistant:

Color Renderer::renderPixel(std::function<Color(Ray, Sampler&)> func, const vec2f& pixelpos, const vec2f& pixelsize) {
	Color res;
	for (int i=0; i<nspp; ++i) {
		Sampler* sampler = new MT19937Sampler((std::hash<float>{}(pixelpos.x)<<2)^std::hash<float>{}(PI*pixelpos.y), i);
		vec2f uv = pixelpos + sampler->get2f() * pixelsize;
		Ray ray = camera->sampleray(uv, *sampler);
		Color tres = func(ray, *sampler);
		/*if (norm(tres)<1e8)*/ res += tres;
		delete sampler;
	}
	return res / nspp;
}